

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::minorInitialiseDevexFramework(HEkkDual *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  long lVar6;
  
  auVar2 = _DAT_003c57d0;
  iVar1 = this->multi_num;
  if (0 < (long)iVar1) {
    lVar3 = (long)iVar1 + -1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar4 = auVar4 ^ _DAT_003c57d0;
    auVar5 = _DAT_003c57c0;
    do {
      auVar7 = auVar5 ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar7._0_4_ ||
                  auVar4._4_4_ < auVar7._4_4_) & 1)) {
        *(undefined8 *)((long)&this->multi_choice[0].infeasEdWt + lVar3) = 0x3ff0000000000000;
      }
      if ((auVar7._12_4_ != auVar4._12_4_ || auVar7._8_4_ <= auVar4._8_4_) &&
          auVar7._12_4_ <= auVar4._12_4_) {
        *(undefined8 *)((long)&this->multi_choice[1].infeasEdWt + lVar3) = 0x3ff0000000000000;
      }
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar3 = lVar3 + 0x490;
    } while ((ulong)(iVar1 + 1U >> 1) * 0x490 - lVar3 != 0);
  }
  this->minor_new_devex_framework = false;
  return;
}

Assistant:

void HEkkDual::minorInitialiseDevexFramework() {
  // Set the local Devex weights to 1
  for (HighsInt i = 0; i < multi_num; i++) {
    multi_choice[i].infeasEdWt = 1.0;
  }
  minor_new_devex_framework = false;
}